

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumBlock
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  allocator local_49;
  string local_48;
  
  bVar1 = ConsumeEndOfDeclaration(this,"{",enum_location);
  if (bVar1) {
    while (bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0), !bVar1) {
      if ((this->input_->current_).type == TYPE_END) {
        std::__cxx11::string::string
                  ((string *)&local_48,"Reached end of input in enum definition (missing \'}\').",
                   &local_49);
        AddError(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        goto LAB_002d87b0;
      }
      bVar1 = ParseEnumStatement(this,enum_type,enum_location,containing_file);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    bVar1 = true;
  }
  else {
LAB_002d87b0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseEnumBlock(EnumDescriptorProto* enum_type,
                            const LocationRecorder& enum_location,
                            const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &enum_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in enum definition (missing '}').");
      return false;
    }

    if (!ParseEnumStatement(enum_type, enum_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}